

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::TriangleDraw::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400                                      \nin vec2 texcoords;                                \nout vec4 FragColor;                               \nuniform sampler2D tex;                            \nvoid main() {                                     \n   FragColor = textureGather(tex, texcoords, 2);  \n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 400                                      \n"
			   "in vec2 texcoords;                                \n"
			   "out vec4 FragColor;                               \n"
			   "uniform sampler2D tex;                            \n"
			   "void main() {                                     \n"
			   "   FragColor = textureGather(tex, texcoords, 2);  \n"
			   "}\n";
	}